

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

bool __thiscall slang::SourceManager::isMacroArgLoc(SourceManager *this,SourceLocation location)

{
  bool bVar1;
  shared_lock<std::shared_mutex> *in_RSI;
  mutex_type *in_RDI;
  shared_lock<std::shared_mutex> lock;
  shared_lock<std::shared_mutex> *this_00;
  SourceManager *in_stack_ffffffffffffffe0;
  SourceLocation in_stack_ffffffffffffffe8;
  
  this_00 = (shared_lock<std::shared_mutex> *)&stack0xffffffffffffffe0;
  std::shared_lock<std::shared_mutex>::shared_lock(this_00,in_RDI);
  bVar1 = isMacroArgLocImpl<std::shared_lock<std::shared_mutex>_>
                    (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8,in_RSI);
  std::shared_lock<std::shared_mutex>::~shared_lock(this_00);
  return bVar1;
}

Assistant:

bool SourceManager::isMacroArgLoc(SourceLocation location) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    return isMacroArgLocImpl(location, lock);
}